

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DebugRenderViewportThumbnail(ImDrawList *draw_list,ImGuiViewportP *viewport,ImRect *bb)

{
  undefined8 *puVar1;
  ImVec2 IVar2;
  ImDrawList *pIVar3;
  ImGuiWindow *this;
  ImFont *font;
  char *text_begin;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined1 auVar15 [16];
  ImGuiWindow *pIVar16;
  ImU32 IVar17;
  ulong uVar18;
  char *text_end;
  uint uVar19;
  ImVec2 IVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar26;
  float fVar27;
  undefined1 auVar25 [16];
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  ImRect IVar33;
  ImVec4 local_c8;
  ImVec2 local_b8;
  ImVec2 IStack_b0;
  ImVec2 local_a8;
  ImVec2 IStack_a0;
  ImVec2 local_98;
  undefined8 uStack_90;
  undefined1 local_88 [8];
  float fStack_80;
  float fStack_7c;
  ImVec2 local_78;
  undefined8 uStack_70;
  ImVec2 local_68;
  undefined8 uStack_60;
  ImVec2 *local_50;
  ImDrawList *local_48;
  ImRect *local_40;
  ImGuiWindow *local_38;
  
  IVar20 = (ImVec2)GImGui;
  local_38 = GImGui->CurrentWindow;
  local_78 = bb->Min;
  uStack_70 = 0;
  _fStack_80 = 0;
  local_88._0_4_ = (bb->Max).x;
  local_88._4_4_ = (bb->Max).y;
  local_68 = (viewport->super_ImGuiViewport).Pos;
  uStack_60 = 0;
  local_98 = (viewport->super_ImGuiViewport).Size;
  uStack_90 = 0;
  pIVar3 = local_38->DrawList;
  local_c8.x = (GImGui->Style).Colors[5].x;
  local_c8.y = (GImGui->Style).Colors[5].y;
  uVar4 = (GImGui->Style).Colors[5].z;
  uVar5 = (GImGui->Style).Colors[5].w;
  local_c8.w = (GImGui->Style).Alpha * 0.4 * (float)uVar5;
  local_c8.z = (float)uVar4;
  local_48 = draw_list;
  IVar17 = ColorConvertFloat4ToU32(&local_c8);
  local_50 = &bb->Max;
  ImDrawList::AddRectFilled(pIVar3,&bb->Min,&bb->Max,IVar17,0.0,0xf);
  if ((((ImGuiContext *)IVar20)->Windows).Size != 0) {
    auVar25._0_4_ = (float)local_88._0_4_ - local_78.x;
    auVar25._4_4_ = (float)local_88._4_4_ - local_78.y;
    auVar25._8_4_ = fStack_80 - (float)uStack_70;
    auVar25._12_4_ = fStack_7c - uStack_70._4_4_;
    auVar15._8_8_ = uStack_90;
    auVar15._0_4_ = local_98.x;
    auVar15._4_4_ = local_98.y;
    _local_88 = divps(auVar25,auVar15);
    local_78.y = local_78.y - local_68.y * local_88._4_4_;
    local_78.x = local_78.x - local_68.x * local_88._0_4_;
    uStack_70 = CONCAT44(uStack_70._4_4_ - uStack_60._4_4_ * local_88._12_4_,
                         (float)uStack_70 - (float)uStack_60 * local_88._8_4_);
    uVar18 = 0;
    local_98 = IVar20;
    local_40 = bb;
    do {
      this = (*(ImGuiWindow ***)((long)IVar20 + 0x1a90))[uVar18];
      if ((this->WasActive == true) && ((this->Flags & 0x1000000) == 0)) {
        local_b8.x = (this->Pos).x;
        local_b8.y = (this->Pos).y;
        IStack_b0.x = (this->Size).x + local_b8.x;
        IStack_b0.y = (this->Size).y + local_b8.y;
        IVar33 = ImGuiWindow::TitleBarRect(this);
        pIVar16 = local_38;
        fVar22 = (float)(int)(local_b8.x * (float)local_88._0_4_ + local_78.x);
        fVar26 = (float)(int)(local_b8.y * (float)local_88._4_4_ + local_78.y);
        fVar28 = (float)(int)(IStack_b0.x * (float)local_88._0_4_ + local_78.x);
        fVar30 = (float)(int)(IStack_b0.y * (float)local_88._4_4_ + local_78.y);
        local_a8.x = (float)(int)(IVar33.Min.x * (float)local_88._0_4_ + local_78.x);
        local_a8.y = (float)(int)(IVar33.Min.y * (float)local_88._4_4_ + local_78.y);
        IStack_a0.x = IVar33.Max.x;
        fVar23 = (float)(int)(IStack_a0.x * (float)local_88._0_4_ + local_78.x);
        fVar29 = local_a8.y + 5.0;
        IStack_a0.x = fVar23;
        IStack_a0.y = fVar29;
        auVar15 = _local_a8;
        fVar21 = (bb->Min).y;
        IVar2 = bb->Max;
        fVar24 = IVar2.x;
        fVar27 = IVar2.y;
        fVar31 = fVar21;
        if ((fVar21 <= fVar26) && (fVar31 = fVar27, fVar26 <= fVar27)) {
          fVar31 = fVar26;
        }
        fVar26 = (bb->Min).x;
        fVar32 = fVar24;
        if (fVar22 <= fVar24) {
          fVar32 = fVar22;
        }
        local_b8.x = (float)(-(uint)(fVar22 < fVar26) & (uint)fVar26 |
                            ~-(uint)(fVar22 < fVar26) & (uint)fVar32);
        local_b8.y = fVar31;
        fVar31 = fVar21;
        if ((fVar21 <= fVar30) && (fVar31 = fVar27, fVar30 <= fVar27)) {
          fVar31 = fVar30;
        }
        fVar22 = fVar24;
        if (fVar28 <= fVar24) {
          fVar22 = fVar28;
        }
        IStack_b0.x = (float)(-(uint)(fVar28 < fVar26) & (uint)fVar26 |
                             ~-(uint)(fVar28 < fVar26) & (uint)fVar22);
        IStack_b0.y = fVar31;
        fVar31 = fVar21;
        if ((fVar21 <= local_a8.y) && (fVar31 = fVar27, local_a8.y <= fVar27)) {
          fVar31 = local_a8.y;
        }
        fVar22 = fVar24;
        if (local_a8.x <= fVar24) {
          fVar22 = local_a8.x;
        }
        local_a8.y = fVar31;
        local_a8.x = (float)(-(uint)(local_a8.x < fVar26) & (uint)fVar26 |
                            ~-(uint)(local_a8.x < fVar26) & (uint)fVar22);
        IStack_a0 = auVar15._8_8_;
        if ((fVar21 <= fVar29) && (fVar21 = fVar27, fVar29 <= fVar27)) {
          fVar21 = fVar29;
        }
        if (fVar23 <= fVar24) {
          IVar2 = (ImVec2)((ulong)IStack_a0 & 0xffffffff);
        }
        IStack_a0.x = (float)(-(uint)(fVar23 < fVar26) & (uint)fVar26 |
                             ~-(uint)(fVar23 < fVar26) & (uint)IVar2.x);
        IStack_a0.y = fVar21;
        if (*(ImGuiWindow **)((long)IVar20 + 0x1ca0) == (ImGuiWindow *)0x0) {
          uVar19 = 10;
        }
        else {
          uVar19 = this->RootWindowForTitleBarHighlight ==
                   (*(ImGuiWindow **)((long)IVar20 + 0x1ca0))->RootWindowForTitleBarHighlight | 10;
        }
        pIVar3 = local_38->DrawList;
        local_c8.x = (GImGui->Style).Colors[2].x;
        local_c8.y = (GImGui->Style).Colors[2].y;
        uVar6 = (GImGui->Style).Colors[2].z;
        uVar7 = (GImGui->Style).Colors[2].w;
        local_c8.w = (GImGui->Style).Alpha * (float)uVar7;
        local_c8.z = (float)uVar6;
        IVar17 = ColorConvertFloat4ToU32(&local_c8);
        ImDrawList::AddRectFilled(pIVar3,&local_b8,&IStack_b0,IVar17,0.0,0xf);
        pIVar3 = pIVar16->DrawList;
        puVar1 = (undefined8 *)((long)&(GImGui->Style).Colors[0].x + (ulong)(uVar19 << 4));
        local_c8._0_8_ = *puVar1;
        uVar8 = puVar1[1];
        local_c8.w = (float)((ulong)uVar8 >> 0x20);
        local_c8.z = (float)uVar8;
        local_c8.w = (GImGui->Style).Alpha * local_c8.w;
        IVar17 = ColorConvertFloat4ToU32(&local_c8);
        ImDrawList::AddRectFilled(pIVar3,&local_a8,&IStack_a0,IVar17,0.0,0xf);
        pIVar3 = pIVar16->DrawList;
        local_c8.x = (GImGui->Style).Colors[5].x;
        local_c8.y = (GImGui->Style).Colors[5].y;
        uVar9 = (GImGui->Style).Colors[5].z;
        uVar10 = (GImGui->Style).Colors[5].w;
        local_c8.w = (GImGui->Style).Alpha * (float)uVar10;
        local_c8.z = (float)uVar9;
        IVar17 = ColorConvertFloat4ToU32(&local_c8);
        ImDrawList::AddRect(pIVar3,&local_b8,&IStack_b0,IVar17,0.0,0xf,1.0);
        IVar20 = local_98;
        pIVar3 = pIVar16->DrawList;
        font = *(ImFont **)((long)local_98 + 0x1978);
        local_68.x = *(float *)((long)local_98 + 0x1980);
        local_c8.x = (GImGui->Style).Colors[0].x;
        local_c8.y = (GImGui->Style).Colors[0].y;
        uVar11 = (GImGui->Style).Colors[0].z;
        uVar12 = (GImGui->Style).Colors[0].w;
        local_c8.w = (GImGui->Style).Alpha * (float)uVar12;
        local_c8.z = (float)uVar11;
        IVar17 = ColorConvertFloat4ToU32(&local_c8);
        text_begin = this->Name;
        text_end = text_begin;
        if (text_begin != (char *)0xffffffffffffffff) {
          do {
            if (*text_end == '#') {
              if (text_end[1] == '#') goto LAB_001e6758;
            }
            else if (*text_end == '\0') goto LAB_001e6758;
            text_end = text_end + 1;
          } while (text_end != (char *)0xffffffffffffffff);
          text_end = (char *)0xffffffffffffffff;
        }
LAB_001e6758:
        ImDrawList::AddText(pIVar3,font,local_68.x,&local_a8,IVar17,text_begin,text_end,0.0,
                            (ImVec4 *)0x0);
        bb = local_40;
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 != (uint)((ImVector<ImGuiWindow_*> *)((long)IVar20 + 0x1a88))->Size);
  }
  local_c8.x = (GImGui->Style).Colors[5].x;
  local_c8.y = (GImGui->Style).Colors[5].y;
  uVar13 = (GImGui->Style).Colors[5].z;
  uVar14 = (GImGui->Style).Colors[5].w;
  local_c8.w = (GImGui->Style).Alpha * (float)uVar14;
  local_c8.z = (float)uVar13;
  IVar17 = ColorConvertFloat4ToU32(&local_c8);
  ImDrawList::AddRect(local_48,&bb->Min,local_50,IVar17,0.0,0xf,1.0);
  return;
}

Assistant:

void ImGui::DebugRenderViewportThumbnail(ImDrawList* draw_list, ImGuiViewportP* viewport, const ImRect& bb)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    ImVec2 scale = bb.GetSize() / viewport->Size;
    ImVec2 off = bb.Min - viewport->Pos * scale;
    float alpha_mul = 1.0f;
    window->DrawList->AddRectFilled(bb.Min, bb.Max, GetColorU32(ImGuiCol_Border, alpha_mul * 0.40f));
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* thumb_window = g.Windows[i];
        if (!thumb_window->WasActive || (thumb_window->Flags & ImGuiWindowFlags_ChildWindow))
            continue;

        ImRect thumb_r = thumb_window->Rect();
        ImRect title_r = thumb_window->TitleBarRect();
        thumb_r = ImRect(ImFloor(off + thumb_r.Min * scale), ImFloor(off +  thumb_r.Max * scale));
        title_r = ImRect(ImFloor(off + title_r.Min * scale), ImFloor(off +  ImVec2(title_r.Max.x, title_r.Min.y) * scale) + ImVec2(0,5)); // Exaggerate title bar height
        thumb_r.ClipWithFull(bb);
        title_r.ClipWithFull(bb);
        const bool window_is_focused = (g.NavWindow && thumb_window->RootWindowForTitleBarHighlight == g.NavWindow->RootWindowForTitleBarHighlight);
        window->DrawList->AddRectFilled(thumb_r.Min, thumb_r.Max, GetColorU32(ImGuiCol_WindowBg, alpha_mul));
        window->DrawList->AddRectFilled(title_r.Min, title_r.Max, GetColorU32(window_is_focused ? ImGuiCol_TitleBgActive : ImGuiCol_TitleBg, alpha_mul));
        window->DrawList->AddRect(thumb_r.Min, thumb_r.Max, GetColorU32(ImGuiCol_Border, alpha_mul));
        window->DrawList->AddText(g.Font, g.FontSize * 1.0f, title_r.Min, GetColorU32(ImGuiCol_Text, alpha_mul), thumb_window->Name, FindRenderedTextEnd(thumb_window->Name));
    }
    draw_list->AddRect(bb.Min, bb.Max, GetColorU32(ImGuiCol_Border, alpha_mul));
}